

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_reading.c
# Opt level: O0

greatest_test_res fr_calendar_dates(void)

{
  int iVar1;
  undefined1 local_78 [8];
  calendar_date_t expected [1];
  calendar_date_t *pcStack_20;
  int record_count;
  calendar_date_t *records;
  FILE *fp;
  
  records = (calendar_date_t *)fopen("../tests/data/google_sample/calendar_dates.txt","r");
  if ((FILE *)records == (FILE *)0x0) {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
    ;
    greatest_info.fail_line = 0x26;
    greatest_info.msg = "Couldn\'t open `data/google_sample/calendar_dates.txt` test file";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  else {
    expected[0].exception_type = read_all_calendar_dates((FILE *)records,&stack0xffffffffffffffe0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (expected[0].exception_type == ET_ADDED) {
      memcpy(local_78,"FULLW",0x50);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_calendar_date((calendar_date_t *)local_78,pcStack_20);
      if (iVar1 == 0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
        ;
        greatest_info.fail_line = 0x35;
        greatest_info.msg = "equal_calendar_date(&(expected[0]), &(records[0]))";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        fp._4_4_ = GREATEST_TEST_RES_FAIL;
      }
      else {
        if (0 < (int)expected[0].exception_type) {
          free(pcStack_20);
        }
        if (records != (calendar_date_t *)0x0) {
          fclose((FILE *)records);
        }
        greatest_info.msg = (char *)0x0;
        fp._4_4_ = GREATEST_TEST_RES_PASS;
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
      ;
      greatest_info.fail_line = 0x2b;
      greatest_info.msg = "1 != record_count";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      fp._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  return fp._4_4_;
}

Assistant:

TEST fr_calendar_dates(void) {
    FILE *fp = fopen("../tests/data/google_sample/calendar_dates.txt", "r");
    if (fp == NULL) {
        FAILm("Couldn't open `data/google_sample/calendar_dates.txt` test file");
    } else {
        calendar_date_t *records;
        int record_count = read_all_calendar_dates(fp, &records);

        ASSERT_EQ(1, record_count);

        calendar_date_t expected[1] = {
            {
                .service_id = "FULLW",
                .date = "20070604",
                .exception_type = ET_REMOVED
            }
        };

        ASSERT(equal_calendar_date(&(expected[0]), &(records[0])));

        if (record_count > 0) free(records);
        if (fp) fclose(fp);
    }
    PASS();
}